

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O2

void __thiscall strict_fstream::Exception::Exception(Exception *this,string *msg)

{
  *(undefined ***)this = &PTR__Exception_00432670;
  std::__cxx11::string::string((string *)&this->_msg,(string *)msg);
  return;
}

Assistant:

Exception(const std::string& msg) : _msg(msg) {}